

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void Curl_cpool_do_locked(Curl_easy *data,connectdata *conn,Curl_cpool_conn_do_cb *cb,void *cbdata)

{
  Curl_share *pCVar1;
  Curl_multi *pCVar2;
  cpool *pcVar3;
  
  if (data != (Curl_easy *)0x0) {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      pCVar2 = data->multi_easy;
      if ((pCVar2 == (Curl_multi *)0x0) && (pCVar2 = data->multi, pCVar2 == (Curl_multi *)0x0))
      goto LAB_0011a91d;
      pcVar3 = &pCVar2->cpool;
    }
    else {
      pcVar3 = &pCVar1->cpool;
    }
    if ((pcVar3->share != (Curl_share *)0x0) && ((pcVar3->share->specifier & 0x20) != 0)) {
      Curl_share_lock(pcVar3->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    pcVar3->field_0x98 = pcVar3->field_0x98 | 1;
    (*cb)(conn,data,cbdata);
    pcVar3->field_0x98 = pcVar3->field_0x98 & 0xfe;
    if ((pcVar3->share != (Curl_share *)0x0) && ((pcVar3->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(pcVar3->idata,CURL_LOCK_DATA_CONNECT);
      return;
    }
    return;
  }
LAB_0011a91d:
  (*cb)(conn,data,cbdata);
  return;
}

Assistant:

void Curl_cpool_do_locked(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_cpool_conn_do_cb *cb, void *cbdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  if(cpool) {
    CPOOL_LOCK(cpool);
    cb(conn, data, cbdata);
    CPOOL_UNLOCK(cpool);
  }
  else
    cb(conn, data, cbdata);
}